

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresultstore.cpp
# Opt level: O3

ResultIteratorBase QtPrivate::findResult(QMap<int,_QtPrivate::ResultItem> *store,int index)

{
  int iVar1;
  const_iterator cVar2;
  const_iterator _mapIterator;
  QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
  *pQVar3;
  int _vectorIndex;
  long in_FS_OFFSET;
  ResultIteratorBase RVar4;
  ResultIteratorBase local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((store == (QMap<int,_QtPrivate::ResultItem> *)0x0) ||
     (store[6].d.d.ptr ==
      (QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
       *)0x0)) {
    cVar2._M_node = (_Rb_tree_node_base *)(store + 2);
    if (store == (QMap<int,_QtPrivate::ResultItem> *)0x0) {
      cVar2._M_node = (_Rb_tree_node_base *)0x0;
    }
  }
  else {
    pQVar3 = store[3].d.d.ptr;
    cVar2._M_node = (_Base_ptr)(store + 2);
    _mapIterator._M_node = cVar2._M_node;
    if (pQVar3 == (QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                   *)0x0) {
LAB_003d1941:
      _mapIterator._M_node = (_Base_ptr)std::_Rb_tree_decrement(_mapIterator._M_node);
      if (*(int *)&_mapIterator._M_node[1]._M_parent == 0) goto LAB_003d1983;
    }
    else {
      do {
        iVar1 = *(int *)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (index <= iVar1) {
          _mapIterator._M_node = (_Base_ptr)pQVar3;
        }
        pQVar3 = *(QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                   **)((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                      (ulong)(iVar1 < index) * 8);
      } while (pQVar3 != (QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                          *)0x0);
      if (_mapIterator._M_node == cVar2._M_node) goto LAB_003d1941;
      if (index < *(int *)&(((QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
                              *)_mapIterator._M_node)->m)._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_left) {
        if ((QMapData<std::map<int,_QtPrivate::ResultItem,_std::less<int>,_std::allocator<std::pair<const_int,_QtPrivate::ResultItem>_>_>_>
             *)_mapIterator._M_node == store[4].d.d.ptr) goto LAB_003d1983;
        _mapIterator._M_node = (_Base_ptr)std::_Rb_tree_decrement(_mapIterator._M_node);
      }
    }
    iVar1 = *(int *)&_mapIterator._M_node[1]._M_parent;
    _vectorIndex = index - _mapIterator._M_node[1]._M_color;
    if ((_vectorIndex < (int)(iVar1 + (uint)(iVar1 == 0))) &&
       (index == _mapIterator._M_node[1]._M_color || iVar1 != 0)) goto LAB_003d1985;
  }
LAB_003d1983:
  _mapIterator._M_node = cVar2._M_node;
  _vectorIndex = 0;
LAB_003d1985:
  ResultIteratorBase::ResultIteratorBase
            (&local_28,(const_iterator)_mapIterator._M_node,_vectorIndex);
  RVar4.m_vectorIndex = local_28.m_vectorIndex;
  RVar4.mapIterator.i._M_node = local_28.mapIterator.i._M_node;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  RVar4._12_4_ = 0;
  return RVar4;
}

Assistant:

static ResultIteratorBase findResult(const QMap<int, ResultItem> &store, int index)
{
    if (store.isEmpty())
        return ResultIteratorBase(store.end());
    QMap<int, ResultItem>::const_iterator it = store.lowerBound(index);

    // lowerBound returns either an iterator to the result or an iterator
    // to the nearest greater index. If the latter happens it might be
    // that the result is stored in a vector at the previous index.
    if (it == store.end()) {
        --it;
        if (it.value().isVector() == false) {
            return ResultIteratorBase(store.end());
        }
    } else {
        if (it.key() > index) {
            if (it == store.begin())
                return ResultIteratorBase(store.end());
            --it;
        }
    }

    const int vectorIndex = index - it.key();

    if (vectorIndex >= it.value().count())
        return ResultIteratorBase(store.end());
    else if (it.value().isVector() == false && vectorIndex != 0)
        return ResultIteratorBase(store.end());
    return ResultIteratorBase(it, vectorIndex);
}